

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_pool_2d_back(ggml_compute_params *params,ggml_tensor *dst)

{
  short *psVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ggml_tensor *pgVar10;
  long lVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  size_t __n;
  long lVar16;
  void *pvVar17;
  long lVar18;
  char *pcVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  undefined8 uVar24;
  long lVar25;
  long lVar26;
  float *pfVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  float *pfVar31;
  ulong uVar32;
  void *__s;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  void *local_98;
  long local_90;
  void *local_48;
  
  if (params->ith == 0) {
    pgVar10 = dst->src[0];
    uVar3 = dst->op_params[0];
    uVar4 = dst->op_params[1];
    uVar5 = dst->op_params[2];
    iVar6 = dst->op_params[3];
    iVar7 = dst->op_params[4];
    iVar8 = dst->op_params[5];
    iVar9 = dst->op_params[6];
    __s = dst->data;
    local_48 = dst->src[1]->data;
    lVar15 = ggml_nbytes(dst);
    if (params->ith != 0) {
      pcVar19 = "params->ith == 0";
      uVar24 = 0x190c;
LAB_00142f5f:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,uVar24,"GGML_ASSERT(%s) failed",pcVar19);
    }
    __n = ggml_nbytes(dst);
    memset(__s,0,__n);
    if (0 < lVar15) {
      pvVar17 = (void *)(lVar15 + (long)__s);
      lVar15 = pgVar10->ne[0];
      lVar11 = pgVar10->ne[1];
      local_98 = pgVar10->data;
      do {
        if (0 < lVar11) {
          local_90 = 0;
          iVar14 = -iVar9;
          do {
            if (0 < lVar15) {
              if (1 < uVar3) {
                pcVar19 = "false";
                uVar24 = 0x195f;
                goto LAB_00142f5f;
              }
              iVar13 = iVar7 * (int)local_90 - iVar9;
              lVar18 = 0;
              iVar22 = -iVar8;
              do {
                lVar23 = (long)iVar22;
                fVar33 = *(float *)((long)local_98 + lVar18 * 4 + local_90 * lVar15 * 4);
                if (uVar3 == 0) {
                  if ((int)uVar5 < 1) {
                    iVar30 = -1;
                    iVar20 = -1;
                  }
                  else {
                    uVar28 = 0xffffffff;
                    uVar32 = 0;
                    auVar35 = ZEXT1664(SUB6416(ZEXT464(0xff7fffff),0));
                    uVar21 = 0xffffffff;
                    lVar16 = (long)iVar14;
                    do {
                      lVar25 = uVar32 + (long)iVar13;
                      if (((-1 < lVar25) && (lVar25 < dst->ne[1])) && (0 < (int)uVar4)) {
                        lVar25 = dst->nb[1] * lVar16;
                        pfVar27 = (float *)((long)local_48 + lVar25 + lVar23 * 4);
                        uVar29 = 0;
                        do {
                          if ((-1 < (long)(lVar23 + uVar29)) &&
                             ((long)(lVar23 + uVar29) < dst->ne[0])) {
                            pfVar31 = pfVar27;
                            if (dst->type != GGML_TYPE_F32) {
                              pfVar31 = (float *)(&ggml_table_f32_f16 +
                                                 (ulong)*(ushort *)
                                                         ((long)local_48 +
                                                         uVar29 * 2 + lVar25 + lVar23 * 2) * 4);
                            }
                            fVar2 = *pfVar31;
                            if (auVar35._0_4_ < fVar2) {
                              uVar21 = uVar32 & 0xffffffff;
                              uVar28 = uVar29 & 0xffffffff;
                            }
                            uVar24 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar35._0_16_,6);
                            bVar12 = (bool)((byte)uVar24 & 1);
                            auVar35 = ZEXT1664(CONCAT124(auVar35._4_12_,
                                                         (uint)bVar12 * (int)fVar2 +
                                                         (uint)!bVar12 * (int)auVar35._0_4_));
                          }
                          uVar29 = uVar29 + 1;
                          pfVar27 = pfVar27 + 1;
                        } while (uVar4 != uVar29);
                      }
                      iVar20 = (int)uVar28;
                      iVar30 = (int)uVar21;
                      uVar32 = uVar32 + 1;
                      lVar16 = lVar16 + 1;
                    } while (uVar32 != uVar5);
                  }
                  if ((iVar20 != -1) && (iVar30 != -1)) {
                    lVar23 = (long)(iVar30 + iVar13) * dst->nb[1];
                    lVar16 = (long)(iVar20 + (iVar6 * (int)lVar18 - iVar8));
                    if (dst->type == GGML_TYPE_F32) {
                      *(float *)((long)__s + lVar16 * 4 + lVar23) =
                           fVar33 + *(float *)((long)__s + lVar16 * 4 + lVar23);
                    }
                    else {
                      auVar34 = vcvtps2ph_f16c(ZEXT416((uint)(fVar33 + *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)__s + lVar16 * 2 + lVar23) * 4))),0
                                              );
                      vpextrw_avx(auVar34,0);
                    }
                  }
                }
                else if (0 < (int)uVar5) {
                  fVar33 = fVar33 / (float)(int)(uVar5 * uVar4);
                  auVar34._4_8_ = SUB128(ZEXT812(0),4);
                  auVar34._0_4_ = fVar33;
                  auVar34._12_4_ = 0;
                  auVar34 = vcvtps2ph_f16c(auVar34,0);
                  uVar21 = 0;
                  lVar16 = (long)iVar14;
                  do {
                    lVar25 = uVar21 + (long)iVar13;
                    if (((-1 < lVar25) && (lVar25 < dst->ne[1])) && (0 < (int)uVar4)) {
                      lVar26 = dst->nb[1] * lVar16;
                      uVar28 = (ulong)uVar4;
                      lVar25 = lVar23;
                      do {
                        if ((-1 < lVar25) && (lVar25 < dst->ne[0])) {
                          if (dst->type == GGML_TYPE_F32) {
                            *(float *)((long)__s + lVar25 * 4 + lVar26) =
                                 fVar33 + *(float *)((long)__s + lVar25 * 4 + lVar26);
                          }
                          else {
                            psVar1 = (short *)((long)__s + lVar25 * 2 + lVar26);
                            *psVar1 = *psVar1 + auVar34._0_2_;
                          }
                        }
                        lVar25 = lVar25 + 1;
                        uVar28 = uVar28 - 1;
                      } while (uVar28 != 0);
                    }
                    uVar21 = uVar21 + 1;
                    lVar16 = lVar16 + 1;
                  } while (uVar21 != uVar5);
                }
                lVar18 = lVar18 + 1;
                iVar22 = iVar22 + iVar6;
              } while (lVar18 != lVar15);
            }
            local_90 = local_90 + 1;
            iVar14 = iVar7 + iVar14;
          } while (local_90 != lVar11);
        }
        __s = (void *)((long)__s + dst->nb[2]);
        local_48 = (void *)((long)local_48 + dst->nb[2]);
        local_98 = (void *)((long)local_98 + lVar11 * lVar15 * 4);
      } while (__s < pvVar17);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_pool_2d_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src  = dst->src[0];
    const ggml_tensor * dstf = dst->src[1]; // forward tensor of dst

    assert(dst->type == GGML_TYPE_F32 || dst->type == GGML_TYPE_F16);

    if (params->ith != 0) {
        return;
    }

    const int32_t * opts = (const int32_t *)dst->op_params;
    ggml_op_pool op = static_cast<ggml_op_pool>(opts[0]);
    const int k0 = opts[1];
    const int k1 = opts[2];
    const int s0 = opts[3];
    const int s1 = opts[4];
    const int p0 = opts[5];
    const int p1 = opts[6];

    char       * cdata  = (char       *) dst->data;
    const char * cdataf = (const char *) dstf->data;
    const char * const data_end = cdata + ggml_nbytes(dst);

    GGML_ASSERT(params->ith == 0);
    memset(cdata, 0, ggml_nbytes(dst));

    const int64_t px = src->ne[0];
    const int64_t py = src->ne[1];
    const int64_t pa = px * py;

    const float * splane = (const float *) src->data;

    const int ka = k0 * k1;
    const int offset0 = -p0;
    const int offset1 = -p1;

    while (cdata < data_end) {
        for (int oy = 0; oy < py; ++oy) {
            const float * const srow = splane + oy * px;
            for (int ox = 0; ox < px; ++ox) {
                const float grad0 = srow[ox];

                const int ix = offset0 + ox * s0;
                const int iy = offset1 + oy * s1;

                if (op == GGML_OP_POOL_MAX) {
                    float maxval = -FLT_MAX;
                    int kxmax = -1;
                    int kymax = -1;

                    for (int ky = 0; ky < k1; ++ky) {
                        if (iy + ky < 0 || iy + ky >= dst->ne[1]) {
                            continue;
                        }
                        const void * drowf = (const void *)(cdataf + dst->nb[1] * (iy + ky));
                        for (int kx = 0; kx < k0; ++kx) {
                            int j = ix + kx;
                            if (j < 0 || j >= dst->ne[0]) {
                                continue;
                            }

                            const float val = dst->type == GGML_TYPE_F32 ?
                                ((const float *) drowf)[j] : GGML_FP16_TO_FP32(((const ggml_fp16_t *) drowf)[j]);
                            if (val <= maxval) {
                                continue;
                            }

                            maxval = val;
                            kxmax = kx;
                            kymax = ky;
                        }
                    }

                    if (kxmax == -1 || kymax == -1) {
                        continue;
                    }

                    void * drow = (void *)(cdata + dst->nb[1] * (iy + kymax));
                    const int j = ix + kxmax;
                    if (dst->type == GGML_TYPE_F32) {
                        ((float *) drow)[j] += grad0;
                    } else {
                        ((ggml_fp16_t *) drow)[j] = GGML_FP32_TO_FP16(grad0 + GGML_FP16_TO_FP32(((const ggml_fp16_t *) drow)[j]));
                    }
                } else if (op == GGML_OP_POOL_AVG) {
                    const float grad = grad0 / ka;

                    for (int ky = 0; ky < k1; ++ky) {
                        if (iy + ky < 0 || iy + ky >= dst->ne[1]) {
                            continue;
                        }
                        void * drow = (void *)(cdata + dst->nb[1] * (iy + ky));
                        for (int kx = 0; kx < k0; ++kx) {
                            int j = ix + kx;
                            if (j < 0 || j >= dst->ne[0]) {
                                continue;
                            }

                            if (dst->type == GGML_TYPE_F32) {
                                ((float *) drow)[j] += grad;
                            } else {
                                ((ggml_fp16_t *) drow)[j] += GGML_FP32_TO_FP16(grad);
                            }
                        }
                    }
                } else {
                    GGML_ASSERT(false);
                }
            }
        }

        cdata  += dst->nb[2];
        cdataf += dst->nb[2];
        splane += pa;
    }
}